

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::BufferIoExecutor::generateExecBufferIo
               (ostream *src,ShaderSpec *spec,char *invocationNdxName)

{
  ostream *poVar1;
  istream *piVar2;
  pointer pSVar3;
  string line;
  istringstream opSrc;
  
  for (pSVar3 = (spec->inputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 != (spec->inputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    poVar1 = std::operator<<(src,"\t");
    glu::decl::DeclareVariable::DeclareVariable
              ((DeclareVariable *)&opSrc,&pSVar3->varType,&pSVar3->name,0);
    poVar1 = glu::decl::operator<<(poVar1,(DeclareVariable *)&opSrc);
    poVar1 = std::operator<<(poVar1," = inputs[");
    poVar1 = std::operator<<(poVar1,invocationNdxName);
    poVar1 = std::operator<<(poVar1,"].");
    poVar1 = std::operator<<(poVar1,(string *)pSVar3);
    std::operator<<(poVar1,";\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
  }
  for (pSVar3 = (spec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 != (spec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    poVar1 = std::operator<<(src,"\t");
    glu::decl::DeclareVariable::DeclareVariable
              ((DeclareVariable *)&opSrc,&pSVar3->varType,&pSVar3->name,0);
    poVar1 = glu::decl::operator<<(poVar1,(DeclareVariable *)&opSrc);
    std::operator<<(poVar1,";\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
  }
  std::operator<<(src,"\n");
  std::__cxx11::istringstream::istringstream((istringstream *)&opSrc,(string *)&spec->source,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&opSrc,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    poVar1 = std::operator<<(src,"\t");
    poVar1 = std::operator<<(poVar1,(string *)&line);
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&opSrc);
  std::operator<<(src,"\n");
  for (pSVar3 = (spec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 != (spec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    poVar1 = std::operator<<(src,"\toutputs[");
    poVar1 = std::operator<<(poVar1,invocationNdxName);
    poVar1 = std::operator<<(poVar1,"].");
    poVar1 = std::operator<<(poVar1,(string *)pSVar3);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,(string *)pSVar3);
    std::operator<<(poVar1,";\n");
  }
  return;
}

Assistant:

void BufferIoExecutor::generateExecBufferIo (std::ostream& src, const ShaderSpec& spec, const char* invocationNdxName)
{
	for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << " = inputs[" << invocationNdxName << "]." << symIter->name << ";\n";

	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << ";\n";

	src << "\n";

	{
		std::istringstream	opSrc	(spec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	src << "\n";
	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\toutputs[" << invocationNdxName << "]." << symIter->name << " = " << symIter->name << ";\n";
}